

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O1

void note(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (test_level != 0) {
    iVar1 = 0;
    do {
      printf("    ");
      iVar1 = iVar1 + 1;
    } while (iVar1 != test_level);
  }
  printf("# ");
  local_e8 = 0x3000000008;
  local_e0 = &arg[0].overflow_arg_area;
  local_d8 = local_c8;
  vprintf(fmt,&local_e8);
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

__attribute__((format (printf, 1, 2)))
void note(const char *fmt, ...)
{
    va_list arg;

    indent();
    printf("# ");

    va_start(arg, fmt);
    vprintf(fmt, arg);
    va_end(arg);

    printf("\n");
    fflush(stdout);
}